

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# canvas.cpp
# Opt level: O2

void NULLCCanvas::CanvasDrawLineNoAA(int x0,int y0,int x1,int y1,Canvas *ptr)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  float fVar8;
  ulong uVar9;
  uint uVar10;
  int x;
  float x_00;
  
  if (ptr == (Canvas *)0x0) {
    nullcThrowError("ERROR: Canvas object is nullptr");
    return;
  }
  uVar2 = y1 - y0;
  uVar6 = -uVar2;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar3 = x1 - x0;
  uVar2 = -uVar3;
  if (0 < (int)uVar3) {
    uVar2 = uVar3;
  }
  x_00 = (float)x0;
  fVar4 = (float)x1;
  if (uVar2 < uVar6) {
    x_00 = (float)y0;
    fVar4 = (float)y1;
    y0 = x0;
    y1 = x1;
  }
  fVar8 = fVar4;
  uVar3 = y1;
  if ((int)fVar4 < (int)x_00) {
    fVar8 = x_00;
    uVar3 = y0;
    x_00 = fVar4;
    y0 = y1;
  }
  uVar10 = (int)fVar8 - (int)x_00;
  iVar5 = uVar3 - y0;
  bVar1 = y0 <= (int)uVar3;
  iVar7 = -iVar5;
  if (0 < iVar5) {
    iVar7 = iVar5;
  }
  uVar9 = (long)(int)uVar10 / 2 & 0xffffffff;
  if ((int)x_00 < 0) {
    y0 = (int)((double)(int)uVar3 * ((double)-(int)x_00 / (double)(int)uVar10) +
              (1.0 - (double)-(int)x_00 / (double)(int)uVar10) * (double)y0);
    x_00 = 0.0;
  }
  fVar4 = ptr->color[(ulong)(uVar2 < uVar6) - 2];
  if ((int)x_00 <= (int)fVar4) {
    uVar3 = (uint)(iVar5 != 0 && bVar1) * 2 - 1;
    if ((int)fVar8 < (int)fVar4) {
      fVar4 = fVar8;
    }
    if (uVar2 < uVar6) {
      for (; (int)x_00 <= (int)fVar4; x_00 = (float)((int)x_00 + 1)) {
        if (((uint)y0 < (uint)ptr->width) && ((uint)x_00 < (uint)ptr->height)) {
          CanvasDrawPointInternal(y0,(uint)x_00,1.0,ptr);
        }
        iVar5 = (int)uVar9 - iVar7;
        uVar6 = iVar5 >> 0x1f;
        y0 = y0 + (uVar6 & uVar3);
        uVar9 = (ulong)(iVar5 + (uVar6 & uVar10));
      }
    }
    else {
      for (; (int)x_00 <= (int)fVar4; x_00 = (float)((int)x_00 + 1)) {
        if (((uint)x_00 < (uint)ptr->width) && ((uint)y0 < (uint)ptr->height)) {
          CanvasDrawPointInternal((uint)x_00,y0,1.0,ptr);
        }
        iVar5 = (int)uVar9 - iVar7;
        uVar6 = iVar5 >> 0x1f;
        y0 = y0 + (uVar6 & uVar3);
        uVar9 = (ulong)(iVar5 + (uVar6 & uVar10));
      }
    }
  }
  return;
}

Assistant:

void CanvasDrawLineNoAA(int x0, int y0, int x1, int y1, Canvas* ptr)
	{
		if(!ptr)
		{
			nullcThrowError("ERROR: Canvas object is nullptr");
			return;
		}
		bool steep = abs(y1 - y0) > abs(x1 - x0);
		if(steep)
		{
			swap(x0, y0);
			swap(x1, y1);
		}
		if(x0 > x1)
		{
			swap(x0, x1);
			swap(y0, y1);
		}
		int deltax = x1 - x0;
		int deltay = abs(y1 - y0);
		int error = deltax / 2;
		int ystep = y0 < y1 ? 1 : -1;
		int y = y0;
		if(x0 < 0)
		{
			double l = double(-x0) / (x1 - x0);
			x0 = 0;
			y = int(y0 * (1.0 - l) + y1 * l);
		}
		if(x0 > (steep ? ptr->height : ptr->width))
			return;
		if(x1 > (steep ? ptr->height : ptr->width))
			x1 = steep ? ptr->height : ptr->width;
		if(steep)
		{
			for(int x = x0; x <= x1; x++)
			{
				if((unsigned)y < (unsigned)ptr->width && (unsigned)x < (unsigned)ptr->height)
					CanvasDrawPointInternal(y, x, 1.0, ptr);
				error -= deltay;
				if(error < 0)
				{
					y += ystep;
					error += deltax;
				}
			}
		}else{
			for(int x = x0; x <= x1; x++)
			{
				if((unsigned)x < (unsigned)ptr->width && (unsigned)y < (unsigned)ptr->height)
					CanvasDrawPointInternal(x, y, 1.0, ptr);
				error -= deltay;
				if(error < 0)
				{
					y += ystep;
					error += deltax;
				}
			}
		}
	}